

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UnicodeString *
icu_63::TimeZone::getCustomID(UnicodeString *id,UnicodeString *normalized,UErrorCode *status)

{
  UBool UVar1;
  int32_t local_38;
  int32_t local_34;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int32_t sign;
  UErrorCode *status_local;
  UnicodeString *normalized_local;
  UnicodeString *id_local;
  
  _hour = status;
  status_local = (UErrorCode *)normalized;
  normalized_local = id;
  UnicodeString::remove(normalized,(char *)normalized);
  UVar1 = ::U_FAILURE(*_hour);
  if (UVar1 == '\0') {
    UVar1 = parseCustomID(normalized_local,&min,&sec,&local_34,&local_38);
    if (UVar1 == '\0') {
      *_hour = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      formatCustomID(sec,local_34,local_38,min < 0,(UnicodeString *)status_local);
    }
    id_local = (UnicodeString *)status_local;
  }
  else {
    id_local = (UnicodeString *)status_local;
  }
  return id_local;
}

Assistant:

UnicodeString&
TimeZone::getCustomID(const UnicodeString& id, UnicodeString& normalized, UErrorCode& status) {
    normalized.remove();
    if (U_FAILURE(status)) {
        return normalized;
    }
    int32_t sign, hour, min, sec;
    if (parseCustomID(id, sign, hour, min, sec)) {
        formatCustomID(hour, min, sec, (sign < 0), normalized);
    } else {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return normalized;
}